

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.h
# Opt level: O1

void __thiscall RegTestingSetup::RegTestingSetup(RegTestingSetup *this)

{
  long lVar1;
  TestOpts opts;
  long in_FS_OFFSET;
  void *pvVar2;
  long lVar3;
  uint in_stack_ffffffffffffffe4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = (void *)0x0;
  lVar3 = 0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  opts.coins_db_in_memory = true;
  opts.block_tree_db_in_memory = true;
  opts.setup_net = true;
  opts.setup_validation_interface = true;
  opts._28_4_ = in_stack_ffffffffffffffe4 & 0xffffff00;
  TestingSetup::TestingSetup(&this->super_TestingSetup,REGTEST,opts);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,lVar3 - (long)pvVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RegTestingSetup()
        : TestingSetup{ChainType::REGTEST} {}